

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__addsizes_valid(int a,int b)

{
  int b_local;
  int a_local;
  
  if (b < 0) {
    b_local = 0;
  }
  else {
    b_local = (int)(a <= 0x7fffffff - b);
  }
  return b_local;
}

Assistant:

static int stbi__addsizes_valid(int a, int b)
{
   if (b < 0) return 0;
   // now 0 <= b <= INT_MAX, hence also
   // 0 <= INT_MAX - b <= INTMAX.
   // And "a + b <= INT_MAX" (which might overflow) is the
   // same as a <= INT_MAX - b (no overflow)
   return a <= INT_MAX - b;
}